

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O1

void __thiscall
slang::ast::NetAliasSymbol::visitExprs<Visitor&>(NetAliasSymbol *this,Result *visitor)

{
  Expression *this_00;
  long lVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  
  sVar2 = getNetReferences(this);
  if (sVar2._M_extent._M_extent_value._M_extent_value != 0) {
    lVar1 = 0;
    do {
      this_00 = *(Expression **)((long)sVar2._M_ptr + lVar1);
      Expression::visitExpression<slang::ast::Expression_const,Visitor&>(this_00,this_00,visitor);
      lVar1 = lVar1 + 8;
    } while (sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1);
  }
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        for (auto expr : getNetReferences())
            expr->visit(visitor);
    }